

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

void __thiscall
google::protobuf::MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void>::
MergeFrom<google::protobuf::RepeatedFieldRef<proto2_unittest::ForeignMessage,void>>
          (MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void> *this,
          RepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *container)

{
  bool bVar1;
  undefined8 uVar2;
  Iterator it;
  iterator local_68;
  RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> local_48;
  
  RepeatedFieldRef<proto2_unittest::ForeignMessage,_void>::begin(&local_68,container);
  while( true ) {
    local_48.data_ = container->data_;
    local_48.accessor_ = container->accessor_;
    local_48.iterator_ = (void *)(**(code **)(*(long *)local_48.accessor_ + 0x50))();
    local_48.scratch_space_._M_t.
    super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
    .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
          )(__uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
            )0x0;
    bVar1 = internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::operator!=
                      (&local_68,&local_48);
    internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::~RepeatedFieldRefIterator
              (&local_48);
    if (!bVar1) break;
    uVar2 = (**(code **)(*(long *)local_68.accessor_ + 0x78))
                      (local_68.accessor_,local_68.data_,local_68.iterator_,
                       local_68.scratch_space_._M_t.
                       super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
                       .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl);
    (**(code **)(**(long **)(this + 8) + 0x28))(*(long **)(this + 8),*(undefined8 *)this,uVar2);
    local_68.iterator_ =
         (void *)(**(code **)(*(long *)local_68.accessor_ + 0x60))
                           (local_68.accessor_,local_68.data_,local_68.iterator_);
  }
  internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::~RepeatedFieldRefIterator
            (&local_68);
  return;
}

Assistant:

void MergeFrom(const Container& container) const {
    typedef typename Container::const_iterator Iterator;
    for (Iterator it = container.begin(); it != container.end(); ++it) {
      Add(*it);
    }
  }